

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_buffer.h
# Opt level: O2

void cio_write_buffer_split_and_append
               (cio_write_buffer *to_head,cio_write_buffer *from_head,cio_write_buffer *wbe)

{
  size_t *psVar1;
  cio_write_buffer *pcVar2;
  cio_write_buffer *pcVar3;
  long lVar4;
  long lVar5;
  cio_write_buffer *pcVar6;
  
  if (from_head->next != from_head) {
    if (from_head == wbe) {
      wbe = from_head->next;
    }
    pcVar2 = to_head->prev;
    pcVar3 = from_head->prev;
    lVar4 = 0;
    lVar5 = 0;
    for (pcVar6 = wbe; pcVar6 != from_head; pcVar6 = pcVar6->next) {
      lVar4 = lVar4 + (pcVar6->data).element.length;
      lVar5 = lVar5 + 1;
    }
    pcVar6 = wbe->prev;
    pcVar6->next = from_head;
    from_head->prev = pcVar6;
    (from_head->data).head.q_len = (from_head->data).head.q_len - lVar5;
    psVar1 = &(from_head->data).element.length;
    *psVar1 = *psVar1 - lVar4;
    pcVar3->next = to_head;
    to_head->prev = pcVar3;
    pcVar2->next = wbe;
    wbe->prev = pcVar2;
    (to_head->data).head.q_len = (to_head->data).head.q_len + lVar5;
    psVar1 = &(to_head->data).element.length;
    *psVar1 = *psVar1 + lVar4;
  }
  return;
}

Assistant:

static inline void cio_write_buffer_split_and_append(struct cio_write_buffer *to_head, struct cio_write_buffer *from_head, struct cio_write_buffer *wbe)
{
	if (cio_unlikely(cio_write_buffer_queue_empty(from_head))) {
		return;
	}

	if (cio_unlikely(from_head == wbe)) {
		wbe = from_head->next;
	}

	struct cio_write_buffer *to_last = to_head->prev;
	struct cio_write_buffer *from_last = from_head->prev;
	size_t tail_length = 0;
	size_t tail_qlen = 0;

	const struct cio_write_buffer *element = wbe;
	while (element != from_head) {
		tail_length += element->data.element.length;
		tail_qlen++;
		element = element->next;
	}

	struct cio_write_buffer *wbe_prev = wbe->prev;
	wbe_prev->next = from_head;
	from_head->prev = wbe_prev;
	from_head->data.head.q_len -= tail_qlen;
	from_head->data.head.total_length -= tail_length;

	from_last->next = to_head;
	to_head->prev = from_last;
	to_last->next = wbe;
	wbe->prev = to_last;
	to_head->data.head.q_len += tail_qlen;
	to_head->data.head.total_length += tail_length;
}